

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::Snapshot::ComputeRelativePathTopBinary(Snapshot *this)

{
  bool bVar1;
  int iVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  Snapshot *pSVar5;
  vector<cmState::Snapshot,_std::allocator<cmState::Snapshot>_> snapshots;
  string result;
  string currentBinary;
  Snapshot snapshot;
  allocator local_a9;
  void *local_a8;
  iterator iStack_a0;
  Snapshot *local_98;
  undefined1 local_88 [32];
  string local_68;
  Snapshot local_48;
  
  local_48.Position.Position = (this->Position).Position;
  local_48.State = this->State;
  local_48.Position.Tree = (this->Position).Tree;
  local_a8 = (void *)0x0;
  iStack_a0._M_current = (Snapshot *)0x0;
  local_98 = (Snapshot *)0x0;
  std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
  _M_realloc_insert<cmState::Snapshot_const&>
            ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_a8,(iterator)0x0,
             &local_48);
  while( true ) {
    GetBuildsystemDirectoryParent((Snapshot *)local_88,&local_48);
    local_48.Position.Position = local_88._16_8_;
    local_48.State = (cmState *)local_88._0_8_;
    local_48.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_88._8_8_;
    bVar1 = IsValid(&local_48);
    if (!bVar1) break;
    if (iStack_a0._M_current == local_98) {
      std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
      _M_realloc_insert<cmState::Snapshot_const&>
                ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_a8,iStack_a0,
                 &local_48);
    }
    else {
      ((iStack_a0._M_current)->Position).Position = local_48.Position.Position;
      (iStack_a0._M_current)->State = local_48.State;
      ((iStack_a0._M_current)->Position).Tree = local_48.Position.Tree;
      iStack_a0._M_current = iStack_a0._M_current + 1;
    }
  }
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                     ((iterator *)((long)local_a8 + 8));
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::__cxx11::string::string
            ((string *)local_88,(pBVar4->OutputLocation)._M_dataplus._M_p,(allocator *)&local_68);
  pSVar5 = (Snapshot *)((long)local_a8 + 0x18);
  if (pSVar5 != iStack_a0._M_current) {
    do {
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&pSVar5->Position);
      pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         (&pSVar3->BuildSystemDirectory);
      std::__cxx11::string::string
                ((string *)&local_68,(pBVar4->OutputLocation)._M_dataplus._M_p,&local_a9);
      bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_88,&local_68);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)local_88);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != iStack_a0._M_current);
  }
  if ((cmLinkedTree<cmState::SnapshotDataType> *)0x1 < (ulong)local_88._8_8_) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)local_88);
    iVar2 = std::__cxx11::string::compare((char *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0) {
      pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
      pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         (&pSVar3->BuildSystemDirectory);
      std::__cxx11::string::_M_replace
                ((ulong)&pBVar4->RelativePathTopBinary,0,
                 (char *)(pBVar4->RelativePathTopBinary)._M_string_length,0x4facd1);
      goto LAB_00230373;
    }
  }
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::__cxx11::string::_M_assign((string *)&pBVar4->RelativePathTopBinary);
LAB_00230373:
  if ((cmState *)local_88._0_8_ != (cmState *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  return;
}

Assistant:

void cmState::Snapshot::ComputeRelativePathTopBinary()
{
  cmState::Snapshot snapshot = *this;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result =
      snapshots.front().GetCurrentBinaryDirectory();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentBinary = it->GetCurrentBinaryDirectory();
    if(cmSystemTools::IsSubDirectory(result, currentBinary))
      {
      result = currentBinary;
      }
    }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if(result.size() < 2 || result.substr(0, 2) != "//")
    {
    this->Position->BuildSystemDirectory->RelativePathTopBinary = result;
    }
  else
    {
    this->Position->BuildSystemDirectory->RelativePathTopBinary = "";
    }
}